

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_perform_fetch(Curl_easy *data)

{
  IMAP *pIVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  pIVar1 = (data->req).p.imap;
  pcVar4 = pIVar1->uid;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = pIVar1->mindex;
    if (pcVar4 == (char *)0x0) {
      Curl_failf(data,"Cannot FETCH without a UID.");
      return CURLE_URL_MALFORMAT;
    }
    pcVar3 = "";
    if (pIVar1->section != (char *)0x0) {
      pcVar3 = pIVar1->section;
    }
    if (pIVar1->partial != (char *)0x0) {
      pcVar5 = "FETCH %s BODY[%s]<%s>";
      goto LAB_001415bf;
    }
    pcVar5 = "FETCH %s BODY[%s]";
  }
  else {
    pcVar3 = "";
    if (pIVar1->section != (char *)0x0) {
      pcVar3 = pIVar1->section;
    }
    if (pIVar1->partial != (char *)0x0) {
      pcVar5 = "UID FETCH %s BODY[%s]<%s>";
LAB_001415bf:
      CVar2 = imap_sendf(data,pcVar5,pcVar4,pcVar3);
      goto LAB_001415fd;
    }
    pcVar5 = "UID FETCH %s BODY[%s]";
  }
  CVar2 = imap_sendf(data,pcVar5,pcVar4,pcVar3);
LAB_001415fd:
  if (CVar2 == CURLE_OK) {
    (data->conn->proto).imapc.state = IMAP_FETCH;
  }
  return CVar2;
}

Assistant:

static CURLcode imap_perform_fetch(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = data->req.p.imap;
  /* Check we have a UID */
  if(imap->uid) {

    /* Send the FETCH command */
    if(imap->partial)
      result = imap_sendf(data, "UID FETCH %s BODY[%s]<%s>",
                          imap->uid, imap->section ? imap->section : "",
                          imap->partial);
    else
      result = imap_sendf(data, "UID FETCH %s BODY[%s]",
                          imap->uid, imap->section ? imap->section : "");
  }
  else if(imap->mindex) {
    /* Send the FETCH command */
    if(imap->partial)
      result = imap_sendf(data, "FETCH %s BODY[%s]<%s>",
                          imap->mindex, imap->section ? imap->section : "",
                          imap->partial);
    else
      result = imap_sendf(data, "FETCH %s BODY[%s]",
                          imap->mindex, imap->section ? imap->section : "");
  }
  else {
    failf(data, "Cannot FETCH without a UID.");
    return CURLE_URL_MALFORMAT;
  }
  if(!result)
    imap_state(data, IMAP_FETCH);

  return result;
}